

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_Tt6MinBase(word *pTruth,int *pVars,int nVars)

{
  ulong t;
  word *pwVar1;
  int iVar;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  if (0 < nVars) {
    uVar2 = (ulong)(uint)nVars;
  }
  t = *pTruth;
  pwVar1 = s_Truths6Neg;
  iVar = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((*pwVar1 & (t >> ((byte)(1 << ((byte)uVar3 & 0x1f)) & 0x3f) ^ t)) != 0) {
      if ((long)iVar < (long)uVar3) {
        if (pVars != (int *)0x0) {
          pVars[iVar] = pVars[uVar3];
        }
        t = Abc_Tt6SwapVars(t,iVar,(int)uVar3);
      }
      iVar = iVar + 1;
    }
    pwVar1 = pwVar1 + 1;
  }
  if (iVar != nVars) {
    if (nVars <= iVar) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                    ,0x65d,"int Abc_Tt6MinBase(word *, int *, int)");
    }
    *pTruth = t;
  }
  return iVar;
}

Assistant:

static inline int Abc_Tt6MinBase( word * pTruth, int * pVars, int nVars ) 
{
    word t = *pTruth;
    int i, k;
    for ( i = k = 0; i < nVars; i++ )
    {
        if ( !Abc_Tt6HasVar( t, i ) )
            continue;
        if ( k < i )
        {
            if ( pVars ) pVars[k] = pVars[i];
            t = Abc_Tt6SwapVars( t, k, i );
        }
        k++;
    }
    if ( k == nVars )
        return k;
    assert( k < nVars );
    *pTruth = t;
    return k;
}